

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obudec.c
# Opt level: O1

int obudec_grow_buffer(size_t growth_amount,uint8_t **obu_buffer,size_t *obu_buffer_capacity)

{
  uint8_t *puVar1;
  int iVar2;
  ulong __size;
  
  iVar2 = -1;
  if (growth_amount != 0 && *obu_buffer != (uint8_t *)0x0) {
    __size = growth_amount + *obu_buffer_capacity;
    if (CARRY8(growth_amount,*obu_buffer_capacity)) {
      obudec_grow_buffer_cold_3();
    }
    else if (__size < 0x200000001) {
      puVar1 = (uint8_t *)realloc(*obu_buffer,__size);
      if (puVar1 == (uint8_t *)0x0) {
        obudec_grow_buffer_cold_1();
      }
      else {
        *obu_buffer = puVar1;
        *obu_buffer_capacity = __size;
        iVar2 = 0;
      }
    }
    else {
      obudec_grow_buffer_cold_2();
    }
  }
  return iVar2;
}

Assistant:

static int obudec_grow_buffer(size_t growth_amount, uint8_t **obu_buffer,
                              size_t *obu_buffer_capacity) {
  if (!*obu_buffer || !obu_buffer_capacity || growth_amount == 0) {
    return -1;
  }

  const size_t capacity = *obu_buffer_capacity;
  if (SIZE_MAX - growth_amount < capacity) {
    fprintf(stderr, "obudec: cannot grow buffer, capacity will roll over.\n");
    return -1;
  }

  const size_t new_capacity = capacity + growth_amount;

#if defined AOM_MAX_ALLOCABLE_MEMORY
  if (new_capacity > AOM_MAX_ALLOCABLE_MEMORY) {
    fprintf(stderr, "obudec: OBU size exceeds max alloc size.\n");
    return -1;
  }
#endif

  uint8_t *new_buffer = (uint8_t *)realloc(*obu_buffer, new_capacity);
  if (!new_buffer) {
    fprintf(stderr, "obudec: Failed to allocate compressed data buffer.\n");
    return -1;
  }

  *obu_buffer = new_buffer;
  *obu_buffer_capacity = new_capacity;
  return 0;
}